

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_branch(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  abi_ptr_conflict addr;
  TCGContext_conflict2 *s_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i32 val;
  TCGLabel *l1;
  abi_ptr_conflict aVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  target_ulong_conflict dest;
  
  s_00 = s->uc->tcg_ctx;
  addr = s->pc;
  uVar4 = (byte)(insn >> 8) & 0xf;
  iVar5 = (uint)insn * 0x1000000;
  if (iVar5 == 0) {
    uVar1 = cpu_lduw_code_m68k(env,addr);
    aVar3 = s->pc + 2;
    s->pc = aVar3;
    uVar6 = (uint)(short)uVar1;
  }
  else if (iVar5 == -0x1000000) {
    uVar1 = cpu_lduw_code_m68k(env,addr);
    aVar3 = s->pc + 2;
    s->pc = aVar3;
    uVar2 = cpu_lduw_code_m68k(env,aVar3);
    aVar3 = s->pc + 2;
    s->pc = aVar3;
    uVar6 = uVar2 & 0xffff | uVar1 << 0x10;
  }
  else {
    uVar6 = iVar5 >> 0x18;
    aVar3 = addr;
  }
  if ((short)uVar4 != 0) {
    if (uVar4 != 1) {
      l1 = gen_new_label_m68k(s_00);
      gen_jmpcc(s,uVar4 ^ 1,l1);
      gen_jmp_tb(s,1,uVar6 + addr);
      *(byte *)l1 = *(byte *)l1 | 1;
      tcg_gen_op1_m68k(s_00,INDEX_op_set_label,(TCGArg)l1);
      dest = s->pc;
      goto LAB_006f96a1;
    }
    val = tcg_const_i32_m68k(s_00,aVar3);
    gen_push(s,val);
  }
  update_cc_op(s);
  dest = uVar6 + addr;
LAB_006f96a1:
  gen_jmp_tb(s,0,dest);
  return;
}

Assistant:

DISAS_INSN(branch)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int32_t offset;
    uint32_t base;
    int op;

    base = s->pc;
    op = (insn >> 8) & 0xf;
    offset = (int8_t)insn;
    if (offset == 0) {
        offset = (int16_t)read_im16(env, s);
    } else if (offset == -1) {
        offset = read_im32(env, s);
    }
    if (op == 1) {
        /* bsr */
        gen_push(s, tcg_const_i32(tcg_ctx, s->pc));
    }
    if (op > 1) {
        /* Bcc */
        TCGLabel *l1 = gen_new_label(tcg_ctx);
        gen_jmpcc(s, ((insn >> 8) & 0xf) ^ 1, l1);
        gen_jmp_tb(s, 1, base + offset);
        gen_set_label(tcg_ctx, l1);
        gen_jmp_tb(s, 0, s->pc);
    } else {
        /* Unconditional branch.  */
        update_cc_op(s);
        gen_jmp_tb(s, 0, base + offset);
    }
}